

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprListSetSortOrder(ExprList *p,int iSortOrder,int eNulls)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  anon_struct_4_9_b482b7ef_for_fg *paVar4;
  
  if (p != (ExprList *)0x0) {
    iVar2 = p->nExpr;
    iVar3 = 0;
    if (iSortOrder != -1) {
      iVar3 = iSortOrder;
    }
    p->a[(long)iVar2 + -1].fg.sortFlags = (byte)iVar3;
    if (eNulls != -1) {
      paVar4 = &p->a[(long)iVar2 + -1].fg;
      puVar1 = &paVar4->field_0x1;
      *puVar1 = *puVar1 | 0x20;
      if (iVar3 != eNulls) {
        paVar4->sortFlags = (byte)iVar3 | 2;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetSortOrder(ExprList *p, int iSortOrder, int eNulls){
  struct ExprList_item *pItem;
  if( p==0 ) return;
  assert( p->nExpr>0 );

  assert( SQLITE_SO_UNDEFINED<0 && SQLITE_SO_ASC==0 && SQLITE_SO_DESC>0 );
  assert( iSortOrder==SQLITE_SO_UNDEFINED
       || iSortOrder==SQLITE_SO_ASC
       || iSortOrder==SQLITE_SO_DESC
  );
  assert( eNulls==SQLITE_SO_UNDEFINED
       || eNulls==SQLITE_SO_ASC
       || eNulls==SQLITE_SO_DESC
  );

  pItem = &p->a[p->nExpr-1];
  assert( pItem->fg.bNulls==0 );
  if( iSortOrder==SQLITE_SO_UNDEFINED ){
    iSortOrder = SQLITE_SO_ASC;
  }
  pItem->fg.sortFlags = (u8)iSortOrder;

  if( eNulls!=SQLITE_SO_UNDEFINED ){
    pItem->fg.bNulls = 1;
    if( iSortOrder!=eNulls ){
      pItem->fg.sortFlags |= KEYINFO_ORDER_BIGNULL;
    }
  }
}